

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O3

int __thiscall
andyzip::brotli_decoder::transform_dictionary_word
          (brotli_decoder *this,char *buffer,uint8_t *src,int transform_idx,int copy_len,
          int ringbuffer_mask)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int i;
  int iVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  uint8_t fermented [24];
  byte local_48 [24];
  
  lVar9 = (long)transform_idx * 0x10;
  cVar3 = (&brotli_data::table)[lVar9];
  pcVar11 = buffer;
  if (cVar3 != '\0') {
    pcVar7 = &brotli_data::table + lVar9;
    do {
      pcVar7 = pcVar7 + 1;
      *pcVar11 = cVar3;
      pcVar11 = pcVar11 + 1;
      cVar3 = *pcVar7;
    } while (cVar3 != '\0');
  }
  bVar1 = (&DAT_00126dd6)[lVar9];
  if (bVar1 < 0xc) {
    if (bVar1 < 3) {
      if ((byte)(bVar1 - 1) < 2) {
        if (copy_len < 0x19) {
          memcpy(local_48,src,(long)copy_len);
        }
        iVar4 = 0;
        do {
          if (copy_len <= iVar4) break;
          lVar5 = (long)iVar4;
          bVar2 = src[lVar5];
          if (bVar2 < 0xc0) {
            iVar6 = 1;
            iVar8 = 1;
            if ((byte)(bVar2 + 0x9f) < 0x1a) {
LAB_00105ed5:
              iVar6 = iVar8;
              local_48[lVar5] = local_48[lVar5] ^ 0x20;
            }
          }
          else {
            if (bVar2 < 0xe0) {
              iVar8 = iVar4 + 1;
              iVar6 = 2;
            }
            else {
              iVar8 = iVar4 + 2;
              iVar6 = 3;
            }
            if (iVar8 < copy_len) {
              lVar5 = (long)iVar8;
              iVar8 = iVar6;
              goto LAB_00105ed5;
            }
          }
          iVar4 = iVar4 + iVar6;
        } while (bVar1 != 1);
        src = local_48;
      }
    }
    else {
      uVar10 = bVar1 - 2;
      copy_len = copy_len - uVar10;
      src = src + uVar10;
    }
  }
  else {
    copy_len = (copy_len - (uint)bVar1) + 0xb;
  }
  if (copy_len != 0) {
    lVar5 = 0;
    do {
      pcVar11[lVar5] = src[lVar5];
      lVar5 = lVar5 + 1;
    } while (copy_len != (int)lVar5);
    pcVar11 = pcVar11 + lVar5;
  }
  cVar3 = (&DAT_00126dd7)[lVar9];
  if (cVar3 != '\0') {
    pcVar7 = &DAT_00126dd8 + lVar9;
    do {
      *pcVar11 = cVar3;
      pcVar11 = pcVar11 + 1;
      cVar3 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar3 != '\0');
  }
  return (int)pcVar11 - (int)buffer;
}

Assistant:

int transform_dictionary_word(char *buffer, const uint8_t *src, int transform_idx, int copy_len, int ringbuffer_mask) {
      char *dest = buffer;
      auto &t = brotli_data::table[transform_idx];
      for (const char *psrc = t.prefix; *psrc; ++psrc) {
        *dest++ = *psrc;
      }

      if (t.id >= brotli_data::OmitLast1) {
        copy_len -= t.id - brotli_data::OmitLast1 + 1;
      } else if (t.id >= brotli_data::OmitFirst1) {
        copy_len -= t.id - brotli_data::OmitFirst1 + 1;
        src += t.id - brotli_data::OmitFirst1 + 1;
      }

      // fermentation (aka. case conversion)
      if (t.id == brotli_data::FermentFirst || t.id == brotli_data::FermentAll) {
        uint8_t fermented[24];
        if (copy_len <= 24) {
          memcpy(fermented, src, copy_len);
        }
  
        for (int i = 0; i < copy_len;) {
          uint8_t chr = src[i];
          if (chr < 192) {
            if (chr >= 97 && chr <= 122) {
              fermented[i] ^= 32;
            }
            ++i;
          } else if (chr < 224) {
            if (i + 1 < copy_len) {
              fermented[i+1] ^= 32;
            }
            i += 2;
          } else {
            if (i + 2 < copy_len) {
              fermented[i+2] ^= 32;
            }
            i += 3;
          }
          if (t.id == brotli_data::FermentFirst) break;
        }
        src = fermented;
      }

      for (int i = 0; i != copy_len; ++i) {
        *dest++ = *src++;
      }

      for (const char *dsrc = t.suffix; *dsrc; ++dsrc) {
        *dest++ = *dsrc;
      }

      return (int)(dest - buffer);
    }